

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

int run_container_shrink_to_fit(run_container_t *src)

{
  int iVar1;
  rle16_t *__ptr;
  int iVar2;
  rle16_t *prVar3;
  int iVar4;
  
  iVar1 = src->n_runs;
  iVar4 = src->capacity - iVar1;
  iVar2 = 0;
  if (iVar4 != 0) {
    src->capacity = iVar1;
    __ptr = src->runs;
    prVar3 = (rle16_t *)roaring_realloc(__ptr,(long)iVar1 << 2);
    src->runs = prVar3;
    iVar2 = iVar4;
    if (prVar3 == (rle16_t *)0x0) {
      roaring_free(__ptr);
    }
  }
  return iVar2;
}

Assistant:

int run_container_shrink_to_fit(run_container_t *src) {
    if (src->n_runs == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->n_runs;
    src->capacity = src->n_runs;
    rle16_t *oldruns = src->runs;
    src->runs =
        (rle16_t *)roaring_realloc(oldruns, src->capacity * sizeof(rle16_t));
    if (src->runs == NULL) roaring_free(oldruns);  // should never happen?
    return savings;
}